

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic.hpp
# Opt level: O3

ssize_t __thiscall
websocketpp::log::basic<websocketpp::concurrency::basic,_websocketpp::log::elevel>::write
          (basic<websocketpp::concurrency::basic,_websocketpp::log::elevel> *this,int __fd,
          void *__buf,size_t __n)

{
  int iVar1;
  ostream *poVar2;
  char *__s;
  size_t sVar3;
  undefined4 extraout_var;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar1 == 0) {
    if ((this->m_dynamic_channels & __fd) != 0) {
      poVar2 = this->m_out;
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
      poVar2 = timestamp(poVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"[",1);
      __s = elevel::channel_name(__fd);
      if (__s == (char *)0x0) {
        std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
      }
      else {
        sVar3 = strlen(__s);
        std::__ostream_insert<char,std::char_traits<char>>(poVar2,__s,sVar3);
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"] ",2);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,*__buf,*(long *)((long)__buf + 8));
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
      std::ostream::flush();
    }
    iVar1 = pthread_mutex_unlock((pthread_mutex_t *)this);
    return CONCAT44(extraout_var,iVar1);
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void write(level channel, std::string const & msg) {
        scoped_lock_type lock(m_lock);
        if (!this->dynamic_test(channel)) { return; }
        *m_out << "[" << timestamp << "] "
                  << "[" << names::channel_name(channel) << "] "
                  << msg << "\n";
        m_out->flush();
    }